

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.c
# Opt level: O3

golf_bvh_node_info_t *
golf_bvh_node_info(golf_bvh_node_info_t *__return_storage_ptr__,golf_bvh_t *bvh,int idx,
                  golf_level_t *level,golf_entity_t *entity,float t)

{
  golf_bvh_aabb_t *aabb;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  float fVar8;
  vec3 *pvVar9;
  vec3 *pvVar10;
  golf_bvh_face_t *pgVar11;
  golf_transform_t transform_00;
  mat4 m;
  mat4 m_00;
  mat4 m_01;
  mat4 m_02;
  golf_transform_t transform_01;
  _Bool _Var12;
  int iVar13;
  golf_model_t *pgVar14;
  golf_movement_t *pgVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  golf_model_group_t *pgVar19;
  char *pcVar20;
  byte bVar21;
  float fVar23;
  vec3 vVar24;
  vec3 vVar25;
  vec3 vVar26;
  vec3 vVar27;
  vec3 v;
  mat4 model_mat;
  golf_transform_t transform;
  golf_model_group_t group;
  golf_material_t material;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  float local_a58;
  float fStack_a54;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  golf_transform_t local_9a8;
  float local_978;
  float fStack_974;
  undefined8 uStack_970;
  golf_transform_t local_968;
  char local_940 [32];
  undefined1 auVar32 [12];
  undefined1 auVar33 [16];
  undefined1 in_stack_fffffffffffff6e0 [32];
  int in_stack_fffffffffffff700;
  float in_stack_fffffffffffff704;
  golf_material_t local_8f8;
  golf_material_t local_490;
  float fVar22;
  
  bVar21 = 0;
  pgVar14 = golf_entity_get_model(entity);
  golf_entity_get_world_transform(&local_968,level,entity);
  pgVar15 = golf_entity_get_movement(entity);
  __return_storage_ptr__->idx = idx;
  __return_storage_ptr__->face_start = (bvh->faces).length;
  __return_storage_ptr__->face_count = (pgVar14->positions).length / 3;
  vVar24 = vec3_create(0.0,0.0,0.0);
  fVar22 = vVar24.z;
  (__return_storage_ptr__->pos).x = (float)(int)vVar24._0_8_;
  (__return_storage_ptr__->pos).y = (float)(int)((ulong)vVar24._0_8_ >> 0x20);
  (__return_storage_ptr__->pos).z = fVar22;
  vVar25 = vec3_create(3.4028235e+38,3.4028235e+38,3.4028235e+38);
  (__return_storage_ptr__->aabb).min.x = (float)(int)vVar25._0_8_;
  (__return_storage_ptr__->aabb).min.y = (float)(int)((ulong)vVar25._0_8_ >> 0x20);
  (__return_storage_ptr__->aabb).min.z = vVar25.z;
  vVar25 = vec3_create(1.1754944e-38,1.1754944e-38,1.1754944e-38);
  (__return_storage_ptr__->aabb).max.x = (float)(int)vVar25._0_8_;
  (__return_storage_ptr__->aabb).max.y = (float)(int)((ulong)vVar25._0_8_ >> 0x20);
  (__return_storage_ptr__->aabb).max.z = vVar25.z;
  local_9a8.scale.y = local_968.scale.y;
  local_9a8.scale.z = local_968.scale.z;
  local_9a8.rotation.y = local_968.rotation.y;
  local_9a8.rotation.z = local_968.rotation.z;
  local_9a8.rotation.w = local_968.rotation.w;
  local_9a8.scale.x = local_968.scale.x;
  local_9a8.position.x = local_968.position.x;
  local_9a8.position.y = local_968.position.y;
  local_9a8.position.z = local_968.position.z;
  local_9a8.rotation.x = local_968.rotation.x;
  if (pgVar15 != (golf_movement_t *)0x0) {
    local_8f8.name._31_8_ = *(undefined8 *)((long)&pgVar15->field_4 + 0x10);
    local_8f8._0_8_ = *(undefined8 *)pgVar15;
    local_8f8.name._7_8_ = *(undefined8 *)&pgVar15->t0;
    local_8f8.name._15_8_ = *(undefined8 *)&pgVar15->field_4;
    local_8f8.name._23_8_ = *(undefined8 *)((long)&pgVar15->field_4 + 8);
    transform_00.position.z = local_968.position.z;
    transform_00.rotation.x = local_968.rotation.x;
    transform_00.position.x = local_968.position.x;
    transform_00.position.y = local_968.position.y;
    transform_00.rotation.y = local_968.rotation.y;
    transform_00.rotation.z = local_968.rotation.z;
    transform_00.rotation.w = local_968.rotation.w;
    transform_00.scale.x = local_968.scale.x;
    transform_00.scale.y = local_968.scale.y;
    transform_00.scale.z = local_968.scale.z;
    golf_transform_apply_movement(&local_9a8,transform_00,*pgVar15,t);
  }
  transform_01.scale.y = (float)in_stack_fffffffffffff700;
  auVar32 = in_stack_fffffffffffff6e0._0_12_;
  auVar33 = in_stack_fffffffffffff6e0._12_16_;
  transform_01.position.x = (float)auVar32._0_4_;
  transform_01.position.y = (float)auVar32._4_4_;
  transform_01.position.z = (float)auVar32._8_4_;
  transform_01.rotation.x = (float)auVar33._0_4_;
  transform_01.rotation.y = (float)auVar33._4_4_;
  transform_01.rotation.z = (float)auVar33._8_4_;
  transform_01.rotation.w = (float)auVar33._12_4_;
  transform_01.scale.x = (float)in_stack_fffffffffffff6e0._28_4_;
  transform_01.scale.z = in_stack_fffffffffffff704;
  golf_transform_get_model_mat(transform_01);
  if ((pgVar14->groups).length < 1) {
    local_a58 = vVar24.x;
    fStack_a54 = vVar24.y;
    fVar4 = local_a58;
    fVar8 = fStack_a54;
  }
  else {
    aabb = &__return_storage_ptr__->aabb;
    lVar18 = 0;
    do {
      pgVar19 = (pgVar14->groups).data + lVar18;
      pcVar20 = local_940;
      for (lVar17 = 0x12; lVar17 != 0; lVar17 = lVar17 + -1) {
        *(undefined4 *)pcVar20 = *(undefined4 *)pgVar19->material_name;
        pgVar19 = (golf_model_group_t *)((long)pgVar19 + ((ulong)bVar21 * -2 + 1) * 4);
        pcVar20 = pcVar20 + (ulong)bVar21 * -8 + 4;
      }
      _Var12 = golf_level_get_material(level,local_940,&local_8f8);
      if (!_Var12) {
        golf_material_texture(&local_490,"",0.0,0.0,0.0,"data/textures/fallback.png");
        memcpy(&local_8f8,&local_490,0x460);
      }
      if (0 < (int)in_stack_fffffffffffff704) {
        lVar17 = 0;
        do {
          pvVar9 = (pgVar14->positions).data;
          lVar16 = (long)(in_stack_fffffffffffff700 + (int)lVar17);
          pvVar10 = pvVar9 + lVar16;
          uVar1 = pvVar10->x;
          uVar5 = pvVar10->y;
          vVar24.y = (float)uVar5;
          vVar24.x = (float)uVar1;
          uVar28 = (undefined4)local_a28;
          uVar29 = (undefined4)((ulong)local_a28 >> 0x20);
          uVar30 = (undefined4)uStack_a20;
          uVar31 = (undefined4)((ulong)uStack_a20 >> 0x20);
          m.m._8_8_ = uStack_a30;
          m.m._0_8_ = local_a38;
          m.m[4] = (float)uVar28;
          m.m[5] = (float)uVar29;
          m.m[6] = (float)uVar30;
          m.m[7] = (float)uVar31;
          m.m._32_8_ = local_a18;
          m.m._40_8_ = uStack_a10;
          m.m._48_8_ = local_a08;
          m.m._56_8_ = uStack_a00;
          vVar24.z = pvVar9[lVar16].z;
          vVar24 = vec3_apply_mat4(vVar24,1.0,m);
          pvVar9 = (pgVar14->positions).data;
          pvVar10 = pvVar9 + lVar16 + 1;
          uVar2 = pvVar10->x;
          uVar6 = pvVar10->y;
          vVar25.y = (float)uVar6;
          vVar25.x = (float)uVar2;
          m_00.m._8_8_ = uStack_a30;
          m_00.m._0_8_ = local_a38;
          m_00.m[4] = (float)uVar28;
          m_00.m[5] = (float)uVar29;
          m_00.m[6] = (float)uVar30;
          m_00.m[7] = (float)uVar31;
          m_00.m._32_8_ = local_a18;
          m_00.m._40_8_ = uStack_a10;
          m_00.m._48_8_ = local_a08;
          m_00.m._56_8_ = uStack_a00;
          vVar25.z = pvVar9[lVar16 + 1].z;
          vVar25 = vec3_apply_mat4(vVar25,1.0,m_00);
          pvVar9 = (pgVar14->positions).data;
          pvVar10 = pvVar9 + lVar16 + 2;
          uVar3 = pvVar10->x;
          uVar7 = pvVar10->y;
          vVar26.y = (float)uVar7;
          vVar26.x = (float)uVar3;
          m_01.m._8_8_ = uStack_a30;
          m_01.m._0_8_ = local_a38;
          m_01.m[4] = (float)uVar28;
          m_01.m[5] = (float)uVar29;
          m_01.m[6] = (float)uVar30;
          m_01.m[7] = (float)uVar31;
          m_01.m._32_8_ = local_a18;
          m_01.m._40_8_ = uStack_a10;
          m_01.m._48_8_ = local_a08;
          m_01.m._56_8_ = uStack_a00;
          vVar26.z = pvVar9[lVar16 + 2].z;
          vVar26 = vec3_apply_mat4(vVar26,1.0,m_01);
          vVar27 = vec3_add(__return_storage_ptr__->pos,vVar24);
          vVar27 = vec3_add(vVar27,vVar25);
          vVar27 = vec3_add(vVar27,vVar26);
          fVar22 = local_8f8.vel_scale;
          (__return_storage_ptr__->pos).x = (float)(int)vVar27._0_8_;
          (__return_storage_ptr__->pos).y = (float)(int)((ulong)vVar27._0_8_ >> 0x20);
          (__return_storage_ptr__->pos).z = vVar27.z;
          local_978 = local_8f8.friction;
          fStack_974 = local_8f8.restitution;
          uStack_970 = 0;
          if (pgVar14->is_water == true) {
            pvVar10 = (pgVar14->water_dir).data;
            m_02.m._8_8_ = uStack_a30;
            m_02.m._0_8_ = local_a38;
            m_02.m[4] = (float)uVar28;
            m_02.m[5] = (float)uVar29;
            m_02.m[6] = (float)uVar30;
            m_02.m[7] = (float)uVar31;
            m_02.m._32_8_ = local_a18;
            m_02.m._40_8_ = uStack_a10;
            m_02.m._48_8_ = local_a08;
            m_02.m._56_8_ = uStack_a00;
            vVar27.z = (&pvVar10->z)[lVar17];
            vVar27._0_8_ = *(undefined8 *)(&pvVar10->x + lVar17);
            vVar27 = vec3_apply_mat4(vVar27,0.0,m_02);
            fVar23 = vVar27.z;
            fVar4 = vVar27.x;
            fVar8 = vVar27.y;
          }
          else {
            vVar27 = vec3_create(0.0,0.0,0.0);
            fVar23 = vVar27.z;
            fVar4 = vVar27.x;
            fVar8 = vVar27.y;
          }
          iVar13 = vec_expand_((char **)bvh,&(bvh->faces).length,&(bvh->faces).capacity,0x58,
                               (bvh->faces).alloc_category);
          if (iVar13 == 0) {
            pgVar11 = (bvh->faces).data;
            iVar13 = (bvh->faces).length;
            (bvh->faces).length = iVar13 + 1;
            pgVar11[iVar13].t = t;
            pgVar11[iVar13].level = level;
            pgVar11[iVar13].entity = entity;
            pgVar11[iVar13].a.x = (float)(int)vVar24._0_8_;
            pgVar11[iVar13].a.y = (float)(int)((ulong)vVar24._0_8_ >> 0x20);
            pgVar11[iVar13].a.z = vVar24.z;
            pgVar11[iVar13].b.x = (float)(int)vVar25._0_8_;
            pgVar11[iVar13].b.y = (float)(int)((ulong)vVar25._0_8_ >> 0x20);
            pgVar11[iVar13].b.z = vVar25.z;
            pgVar11[iVar13].c.x = (float)(int)vVar26._0_8_;
            pgVar11[iVar13].c.y = (float)(int)((ulong)vVar26._0_8_ >> 0x20);
            pgVar11[iVar13].c.z = vVar26.z;
            pgVar11[iVar13].water_dir.x = fVar4;
            pgVar11[iVar13].water_dir.y = fVar8;
            pgVar11[iVar13].water_dir.z = fVar23;
            pgVar11[iVar13].restitution = fStack_974;
            pgVar11[iVar13].friction = local_978;
            pgVar11[iVar13].vel_scale = fVar22;
          }
          _update_aabb(aabb,vVar24);
          _update_aabb(aabb,vVar25);
          _update_aabb(aabb,vVar26);
          lVar17 = lVar17 + 3;
        } while ((int)lVar17 < (int)in_stack_fffffffffffff704);
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < (pgVar14->groups).length);
    fVar4 = (__return_storage_ptr__->pos).x;
    fVar8 = (__return_storage_ptr__->pos).y;
    fVar22 = (__return_storage_ptr__->pos).z;
  }
  v.y = fVar8;
  v.x = fVar4;
  v.z = fVar22;
  vVar24 = vec3_scale(v,1.0 / (float)(pgVar14->positions).length);
  (__return_storage_ptr__->pos).x = (float)(int)vVar24._0_8_;
  (__return_storage_ptr__->pos).y = (float)(int)((ulong)vVar24._0_8_ >> 0x20);
  (__return_storage_ptr__->pos).z = vVar24.z;
  return __return_storage_ptr__;
}

Assistant:

golf_bvh_node_info_t golf_bvh_node_info(golf_bvh_t *bvh, int idx, golf_level_t *level, golf_entity_t *entity, float t) {
    golf_model_t *model = golf_entity_get_model(entity);
    golf_transform_t transform = golf_entity_get_world_transform(level, entity);
    golf_movement_t *movement = golf_entity_get_movement(entity);

    golf_bvh_node_info_t info;
    info.idx = idx;
    info.face_start = bvh->faces.length;
    info.face_count = model->positions.length / 3;
    info.pos = V3(0, 0, 0);
    info.aabb.min = V3(FLT_MAX, FLT_MAX, FLT_MAX);
    info.aabb.max = V3(FLT_MIN, FLT_MIN, FLT_MIN);

    golf_transform_t moved_transform = transform;
    if (movement) {
        moved_transform = golf_transform_apply_movement(moved_transform, *movement, t);
    }
    mat4 model_mat = golf_transform_get_model_mat(moved_transform);

    for (int i = 0; i < model->groups.length; i++) {
        golf_model_group_t group = model->groups.data[i];

        golf_material_t material;
        if (!golf_level_get_material(level, group.material_name, &material)) {
            material = golf_material_texture("", 0, 0, 0, "data/textures/fallback.png");
        }

        for (int j = 0; j < group.vertex_count; j += 3) {
            int v_idx = group.start_vertex + j;
            vec3 a = vec3_apply_mat4(model->positions.data[v_idx + 0], 1, model_mat);
            vec3 b = vec3_apply_mat4(model->positions.data[v_idx + 1], 1, model_mat);
            vec3 c = vec3_apply_mat4(model->positions.data[v_idx + 2], 1, model_mat);

            info.pos = vec3_add(info.pos, a);
            info.pos = vec3_add(info.pos, b);
            info.pos = vec3_add(info.pos, c);

            golf_bvh_face_t face;
            face.a = a;
            face.b = b;
            face.c = c;
            face.restitution = material.restitution;
            face.friction = material.friction;
            face.vel_scale = material.vel_scale;
            face.level = level;
            face.entity = entity;
            face.t = t;
            if (model->is_water) {
                face.water_dir = vec3_apply_mat4(model->water_dir.data[j / 3], 0, model_mat);
            }
            else {
                face.water_dir = V3(0, 0, 0);
            }
            vec_push(&bvh->faces, face);

            _update_aabb(&info.aabb, a);
            _update_aabb(&info.aabb, b);
            _update_aabb(&info.aabb, c);
        }
    }

    info.pos = vec3_scale(info.pos, 1.0f / model->positions.length);

    return info;
}